

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O2

void __thiscall
duckdb::Serializer::WriteValue<duckdb::ColumnStatistics>(Serializer *this,ColumnStatistics *ptr)

{
  if (ptr == (ColumnStatistics *)0x0) {
    (*this->_vptr_Serializer[10])(this,0);
  }
  else {
    (*this->_vptr_Serializer[10])(this,1);
    WriteValue<duckdb::ColumnStatistics>(this,ptr);
  }
  (*this->_vptr_Serializer[0xb])(this);
  return;
}

Assistant:

void WriteValue(const T *ptr) {
		if (ptr == nullptr) {
			OnNullableBegin(false);
			OnNullableEnd();
		} else {
			OnNullableBegin(true);
			WriteValue(*ptr);
			OnNullableEnd();
		}
	}